

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O1

REF_STATUS ref_adapt_tattle(REF_GRID ref_grid,char *mode)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_ADAPT pRVar3;
  REF_MPI pRVar4;
  REF_STATUS RVar5;
  uint uVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  REF_INT nnode;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL min_normdev;
  REF_DBL min_quality;
  REF_EDGE ref_edge;
  REF_DBL ratio;
  REF_DBL quality;
  REF_INT part;
  REF_DBL normdev;
  REF_DBL delta;
  REF_INT nodes [27];
  uint local_118;
  int local_114;
  REF_MPI local_110;
  REF_GRID local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  REF_EDGE local_e0;
  double local_d8;
  double local_d0;
  int local_c4;
  double local_c0;
  char *local_b8;
  REF_DBL local_b0;
  REF_INT local_a8 [30];
  
  lVar7 = 0x28;
  if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
    lVar7 = 0x50;
  }
  local_110 = ref_grid->mpi;
  pRVar1 = ref_grid->node;
  pRVar2 = *(REF_CELL *)((long)ref_grid->cell + lVar7 + -0x10);
  local_e8 = 1.0;
  local_108 = ref_grid;
  local_b8 = mode;
  if (0 < pRVar2->max) {
    iVar12 = 0;
    do {
      RVar5 = ref_cell_nodes(pRVar2,iVar12,local_a8);
      if (RVar5 == 0) {
        if (ref_grid->twod == 0) {
          if (ref_grid->surf == 0) {
            uVar6 = ref_node_tet_quality(ref_grid->node,local_a8,&local_d0);
            if (uVar6 != 0) {
              uVar9 = 0x192;
              goto LAB_001eac01;
            }
          }
          else {
            uVar6 = ref_node_tri_quality(ref_grid->node,local_a8,&local_d0);
            if (uVar6 != 0) {
              uVar9 = 399;
LAB_001eac01:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,uVar9,"ref_adapt_tattle",(ulong)uVar6,"qual");
              local_118 = uVar6;
            }
          }
        }
        else {
          uVar6 = ref_node_tri_quality(ref_grid->node,local_a8,&local_d0);
          if (uVar6 != 0) {
            uVar9 = 0x18c;
            goto LAB_001eac01;
          }
        }
        if (uVar6 != 0) {
          return local_118;
        }
        ref_grid = local_108;
        if (local_d0 <= local_e8) {
          local_e8 = local_d0;
        }
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < pRVar2->max);
  }
  pRVar4 = local_110;
  local_d0 = local_e8;
  local_118 = ref_mpi_min(local_110,&local_d0,&local_e8,3);
  if (local_118 == 0) {
    local_118 = ref_mpi_bcast(pRVar4,&local_d0,1,3);
    if (local_118 == 0) {
      local_114 = 0;
      if (0 < pRVar1->max) {
        iVar12 = 0;
        lVar7 = 0;
        do {
          if ((-1 < pRVar1->global[lVar7]) && (pRVar1->ref_mpi->id == pRVar1->part[lVar7])) {
            iVar12 = iVar12 + 1;
            local_114 = iVar12;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < pRVar1->max);
      }
      local_118 = ref_mpi_allsum(pRVar4,&local_114,1,1);
      if (local_118 == 0) {
        local_f0 = 2.0;
        if (((ref_grid->geom->model != (void *)0x0) || (ref_grid->geom->meshlink != (void *)0x0)) &&
           (pRVar2 = ref_grid->cell[3], 0 < pRVar2->max)) {
          iVar12 = 0;
          do {
            RVar5 = ref_cell_nodes(pRVar2,iVar12,local_a8);
            if (RVar5 == 0) {
              uVar6 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_c0);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                       ,0x1a7,"ref_adapt_tattle",(ulong)uVar6,"norm dev");
                return uVar6;
              }
              ref_grid = local_108;
              if (local_c0 <= local_f0) {
                local_f0 = local_c0;
              }
            }
            iVar12 = iVar12 + 1;
          } while (iVar12 < pRVar2->max);
        }
        pRVar4 = local_110;
        local_c0 = local_f0;
        local_118 = ref_mpi_min(local_110,&local_c0,&local_f0,3);
        if (local_118 == 0) {
          local_118 = ref_mpi_bcast(pRVar4,&local_f0,1,3);
          if (local_118 == 0) {
            local_f8 = 1e+200;
            local_100 = -1e+200;
            local_118 = ref_edge_create(&local_e0,ref_grid);
            if (local_118 == 0) {
              if (0 < local_e0->n) {
                lVar7 = 0;
                do {
                  uVar6 = ref_edge_part(local_e0,(REF_INT)lVar7,&local_c4);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                           ,0x1b3,"ref_adapt_tattle",(ulong)uVar6,"edge part");
                    return uVar6;
                  }
                  if (local_c4 == local_108->mpi->id) {
                    uVar6 = ref_node_ratio(local_108->node,local_e0->e2n[lVar7 * 2],
                                           local_e0->e2n[lVar7 * 2 + 1],&local_d8);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                             ,0x1b8,"ref_adapt_tattle",(ulong)uVar6,"rat");
                      return uVar6;
                    }
                    if (local_d8 <= local_f8) {
                      local_f8 = local_d8;
                    }
                    if (local_100 <= local_d8) {
                      local_100 = local_d8;
                    }
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 < local_e0->n);
              }
              local_118 = ref_edge_free(local_e0);
              pRVar4 = local_110;
              if (local_118 == 0) {
                local_d8 = local_f8;
                local_118 = ref_mpi_min(local_110,&local_d8,&local_f8,3);
                if (local_118 == 0) {
                  local_118 = ref_mpi_bcast(pRVar4,&local_f8,1,3);
                  if (local_118 == 0) {
                    local_d8 = local_100;
                    local_118 = ref_mpi_max(pRVar4,&local_d8,&local_100,3);
                    if (local_118 == 0) {
                      local_118 = ref_mpi_bcast(local_110,&local_100,1,3);
                      if (local_118 == 0) {
                        local_118 = ref_mpi_stopwatch_delta(local_110,&local_b0);
                        if (local_118 == 0) {
                          local_118 = 0;
                          if (local_108->mpi->id == 0) {
                            pRVar3 = local_108->adapt;
                            uVar9 = 0x20;
                            if (local_e8 < pRVar3->smooth_min_quality) {
                              uVar9 = 0x2a;
                            }
                            uVar10 = 0x20;
                            if (local_f8 < pRVar3->post_min_ratio) {
                              uVar10 = 0x2a;
                            }
                            uVar8 = 0x20;
                            if (pRVar3->post_max_ratio <= local_100 &&
                                local_100 != pRVar3->post_max_ratio) {
                              uVar8 = 0x2a;
                            }
                            uVar11 = 0x20;
                            if (local_f0 < pRVar3->post_min_normdev) {
                              uVar11 = 0x2a;
                            }
                            printf("mr %c %6.4f ratio %c %6.4f %6.2f %c norm %6.4f %c %4.1f sec %5s n %d\n"
                                   ,uVar9,uVar10,uVar8,uVar11,local_b8,local_114);
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                 ,0x1c5,"ref_adapt_tattle",(ulong)local_118,"time delta");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                               ,0x1c3,"ref_adapt_tattle",(ulong)local_118,"max");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                             ,0x1c2,"ref_adapt_tattle",(ulong)local_118,"mpi max");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                           ,0x1c0,"ref_adapt_tattle",(ulong)local_118,"min");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                         ,0x1bf,"ref_adapt_tattle",(ulong)local_118,"mpi min");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                       ,0x1bd,"ref_adapt_tattle",(ulong)local_118,"free edge");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,0x1b1,"ref_adapt_tattle",(ulong)local_118,"make edges");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0x1ad,"ref_adapt_tattle",(ulong)local_118,"min");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x1ac,"ref_adapt_tattle",(ulong)local_118,"mpi max");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x1a0,"ref_adapt_tattle",(ulong)local_118,"int sum");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x198
             ,"ref_adapt_tattle",(ulong)local_118,"min");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x197,
           "ref_adapt_tattle",(ulong)local_118,"min");
  }
  return local_118;
}

Assistant:

REF_FCN static REF_STATUS ref_adapt_tattle(REF_GRID ref_grid,
                                           const char *mode) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality, min_quality;
  REF_DBL normdev, min_normdev;
  REF_INT node, nnode;
  REF_DBL ratio, min_ratio, max_ratio, delta;
  REF_INT edge, part;
  REF_EDGE ref_edge;
  char is_ok = ' ';
  char not_ok = '*';
  char quality_met, short_met, long_met, normdev_met;

  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  min_quality = 1.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
    } else if (ref_grid_surf(ref_grid)) {
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
    } else {
      RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
    }
    min_quality = MIN(min_quality, quality);
  }
  quality = min_quality;
  RSS(ref_mpi_min(ref_mpi, &quality, &min_quality, REF_DBL_TYPE), "min");
  RSS(ref_mpi_bcast(ref_mpi, &quality, 1, REF_DBL_TYPE), "min");

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nnode++;
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, &nnode, 1, REF_INT_TYPE), "int sum");

  min_normdev = 2.0;
  if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
      ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
      min_normdev = MIN(min_normdev, normdev);
    }
  }
  normdev = min_normdev;
  RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");

  min_ratio = REF_DBL_MAX;
  max_ratio = REF_DBL_MIN;
  RSS(ref_edge_create(&ref_edge, ref_grid), "make edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      min_ratio = MIN(min_ratio, ratio);
      max_ratio = MAX(max_ratio, ratio);
    }
  }
  RSS(ref_edge_free(ref_edge), "free edge");
  ratio = min_ratio;
  RSS(ref_mpi_min(ref_mpi, &ratio, &min_ratio, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_ratio, 1, REF_DBL_TYPE), "min");
  ratio = max_ratio;
  RSS(ref_mpi_max(ref_mpi, &ratio, &max_ratio, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_ratio, 1, REF_DBL_TYPE), "max");

  RSS(ref_mpi_stopwatch_delta(ref_mpi, &delta), "time delta");

  if (ref_grid_once(ref_grid)) {
    quality_met = is_ok;
    short_met = is_ok;
    long_met = is_ok;
    normdev_met = is_ok;
    if (min_quality < ref_grid_adapt(ref_grid, smooth_min_quality))
      quality_met = not_ok;
    if (min_ratio < ref_grid_adapt(ref_grid, post_min_ratio))
      short_met = not_ok;
    if (max_ratio > ref_grid_adapt(ref_grid, post_max_ratio)) long_met = not_ok;
    if (min_normdev < ref_grid_adapt(ref_grid, post_min_normdev))
      normdev_met = not_ok;

    printf(
        "mr %c %6.4f ratio %c %6.4f %6.2f %c norm %6.4f %c %4.1f sec "
        "%5s n %d\n",
        quality_met, min_quality, short_met, min_ratio, max_ratio, long_met,
        min_normdev, normdev_met, delta, mode, nnode);
  }

  return REF_SUCCESS;
}